

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  uchar value;
  ulong uVar2;
  char *pcVar3;
  Message m;
  string local_50;
  
  Message::Message(&m);
  uVar2 = 0;
  do {
    if (str->_M_string_length <= uVar2) {
      StringStreamToString(__return_storage_ptr__,(stringstream *)m.ss_.ptr_);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&m.ss_);
      return __return_storage_ptr__;
    }
    bVar1 = (str->_M_dataplus)._M_p[uVar2];
    pcVar3 = "\\b";
    switch(bVar1) {
    case 8:
      break;
    case 9:
      pcVar3 = "\\t";
      break;
    case 10:
      pcVar3 = "\\n";
      break;
    case 0xb:
switchD_0013312c_caseD_b:
      if ((char)bVar1 < ' ') {
        std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),"\\u00");
        String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)bVar1,value);
        std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),bVar1);
      }
      goto LAB_001331e0;
    case 0xc:
      pcVar3 = "\\f";
      break;
    case 0xd:
      pcVar3 = "\\r";
      break;
    default:
      if ((0x3a < bVar1 - 0x22) || ((0x400000000002001U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0)
         ) goto switchD_0013312c_caseD_b;
      std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),'\\');
      std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),bVar1);
      goto LAB_001331e0;
    }
    std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),pcVar3);
LAB_001331e0:
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}